

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O2

OBJ_INDEX_DATA * get_obj_index(int vnum)

{
  OBJ_INDEX_DATA *pOVar1;
  string_view fmt;
  int vnum_local;
  
  pOVar1 = (OBJ_INDEX_DATA *)(obj_index_hash + vnum % 0x400);
  do {
    pOVar1 = pOVar1->next;
    if (pOVar1 == (OBJ_INDEX_DATA *)0x0) {
      if (!fBootDb) {
        return pOVar1;
      }
      fmt._M_str = "Get_obj_index: bad vnum {}.";
      fmt._M_len = 0x1b;
      CLogger::Error<int&>((CLogger *)&RS.field_0x140,fmt,&vnum_local);
      exit(1);
    }
  } while (pOVar1->vnum != vnum);
  return pOVar1;
}

Assistant:

OBJ_INDEX_DATA *get_obj_index(int vnum)
{
	OBJ_INDEX_DATA *pObjIndex;

	for (pObjIndex = obj_index_hash[vnum % MAX_KEY_HASH]; pObjIndex != nullptr; pObjIndex = pObjIndex->next)
	{
		if (pObjIndex->vnum == vnum)
			return pObjIndex;
	}

	if (fBootDb)
	{
		RS.Logger.Error("Get_obj_index: bad vnum {}.", vnum);
		exit(1);
	}

	return nullptr;
}